

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::FetchCommittedRangeValidity
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  uint uVar1;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  
  FlatVector::VerifyFlatVector(result);
  uVar1 = info->max;
  uVar3 = 0;
  do {
    if (info->N <= uVar3) {
      return;
    }
    uVar2 = (ulong)*(uint *)((long)&info[1].segment + uVar3 * 4);
    if (start <= uVar2) {
      if (end <= uVar2) {
        return;
      }
      TemplatedValidityMask<unsigned_long>::Set
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 uVar2 + (result_offset - start),
                 *(bool *)((long)&info[1].segment + uVar3 + (ulong)uVar1 * 4));
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void FetchCommittedRangeValidity(UpdateInfo &info, idx_t start, idx_t end, idx_t result_offset, Vector &result) {
	auto &result_mask = FlatVector::Validity(result);
	MergeUpdateInfoRangeValidity(info, start, end, result_offset, result_mask);
}